

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O2

void string_storage_enumerate_recursive
               (string_struct *ss,string_storage_enumerate_callback cb,void *user_data,char *parent,
               size_t user_data_size)

{
  string_struct *psVar1;
  ulong uVar2;
  long lVar3;
  ulong __n;
  char buf [256];
  char local_138 [255];
  undefined1 local_39;
  
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < ss->child_count; uVar2 = uVar2 + 1) {
    psVar1 = ss->children;
    __n = (ulong)**(byte **)((long)&psVar1->value + lVar3);
    memcpy(local_138,parent,__n);
    strncpy(local_138 + __n,(char *)(*(long *)((long)&psVar1->value + lVar3) + user_data_size + 1),
            __n ^ 0xff);
    local_39 = 0;
    (*cb)(user_data,local_138,(void *)(*(long *)((long)&psVar1->value + lVar3) + 1));
    string_storage_enumerate_recursive
              ((string_struct *)((long)&ss->children->value + lVar3),cb,user_data,local_138,
               user_data_size);
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void string_storage_enumerate_recursive(const struct string_struct *ss, string_storage_enumerate_callback cb, void *user_data, const char *parent, size_t user_data_size)
{
	char buf[256];
	size_t i;
	for (i = 0; i < ss->child_count; i++)
	{
		uint8_t prev = *(uint8_t*)ss->children[i].value;
		memcpy(buf, parent, prev);
		strncpy(buf + prev, ss->children[i].value + 1 + user_data_size, 255 - prev);
		buf[255] = 0;
		cb(user_data, buf, ss->children[i].value + 1);
		string_storage_enumerate_recursive(&ss->children[i], cb, user_data, buf, user_data_size);
	}
}